

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

int32_t __thiscall
icu_63::OlsonTimeZone::countTransitionRules(OlsonTimeZone *this,UErrorCode *status)

{
  int iVar1;
  long lVar2;
  int32_t iVar3;
  
  iVar3 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    checkTransitionRules(this,status);
    iVar3 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar3 = 0;
      if ((this->historicRules != (TimeArrayTimeZoneRule **)0x0) &&
         (0 < (long)this->historicRuleCount)) {
        lVar2 = 0;
        iVar3 = 0;
        do {
          iVar3 = (iVar3 + 1) - (uint)(this->historicRules[lVar2] == (TimeArrayTimeZoneRule *)0x0);
          lVar2 = lVar2 + 1;
        } while (this->historicRuleCount != lVar2);
      }
      if (this->finalZone != (SimpleTimeZone *)0x0) {
        iVar1 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                  [9])();
        if ((char)iVar1 == '\0') {
          iVar3 = iVar3 + 1;
        }
        else {
          iVar3 = iVar3 + 2;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int32_t
OlsonTimeZone::countTransitionRules(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return 0;
    }
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t count = 0;
    if (historicRules != NULL) {
        // historicRules may contain null entries when original zoneinfo data
        // includes non transition data.
        for (int32_t i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                count++;
            }
        }
    }
    if (finalZone != NULL) {
        if (finalZone->useDaylightTime()) {
            count += 2;
        } else {
            count++;
        }
    }
    return count;
}